

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

ostream * __thiscall nivalis::Expr::to_bin(Expr *this,ostream *os)

{
  ASTNode val;
  size_type sVar1;
  ostream *in_RSI;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_RDI;
  size_t i;
  unsigned_long in_stack_ffffffffffffffb8;
  ostream *poVar2;
  ostream *in_stack_ffffffffffffffc0;
  anon_union_8_3_343d95dd_for_ASTNode_1 aVar3;
  undefined8 local_18;
  
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::size(in_RDI);
  util::write_bin<unsigned_long>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  local_18 = 0;
  while( true ) {
    aVar3 = local_18;
    sVar1 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::size
                      (in_RDI);
    if (sVar1 <= aVar3.ref) break;
    poVar2 = in_RSI;
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::operator[]
              (in_RDI,local_18);
    val.field_1.ref = aVar3.ref;
    val._0_8_ = poVar2;
    util::write_bin<nivalis::Expr::ASTNode>((ostream *)0x12a1d9,val);
    local_18 = local_18 + 1;
  }
  return in_RSI;
}

Assistant:

std::ostream& Expr::to_bin(std::ostream& os) const {
    util::write_bin(os, ast.size());
    for (size_t i = 0; i < ast.size(); ++i) {
        util::write_bin(os, ast[i]);
    }
    return os;
}